

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::Convert_abi_cxx11_
          (String *__return_storage_ptr__,HLSL2GLSLConverterImpl *this,ConversionAttribs *Attribs)

{
  bool bVar1;
  ConversionStream *this_00;
  string _msg;
  
  if (Attribs->ppConversionStream == (IHLSL2GLSLConversionStream **)0x0) {
    ConversionStream::ConversionStream
              ((ConversionStream *)&_msg,(IReferenceCounters *)0x0,this,Attribs->InputFileName,
               Attribs->pSourceStreamFactory,Attribs->HLSLSource,Attribs->NumSymbols,false);
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,(ConversionStream *)&_msg,Attribs->EntryPoint,
               Attribs->ShaderType,Attribs->IncludeDefinitions,Attribs->SamplerSuffix,
               Attribs->UseInOutLocationQualifiers,Attribs->UseRowMajorMatrices);
    ConversionStream::~ConversionStream((ConversionStream *)&_msg);
  }
  else {
    this_00 = (ConversionStream *)*Attribs->ppConversionStream;
    if (this_00 != (ConversionStream *)0x0) {
      CheckDynamicType<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                ((IHLSL2GLSLConversionStream *)this_00);
      bVar1 = std::operator!=(&this_00->m_InputFileName,Attribs->InputFileName);
      if (bVar1) {
        FormatString<char[46],std::__cxx11::string,char[61],char_const*,char[30]>
                  (&_msg,(Diligent *)"Input stream was initialized for input file \"",
                   (char (*) [46])&this_00->m_InputFileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\" that does not match the name of the file to be converted \"",
                   (char (*) [61])&Attribs->InputFileName,(char **)"\". New stream will be created",
                   (char (*) [30])_msg._M_dataplus._M_p);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&_msg);
        (*((*Attribs->ppConversionStream)->super_IObject)._vptr_IObject[2])();
        *Attribs->ppConversionStream = (IHLSL2GLSLConversionStream *)0x0;
      }
    }
    if (*Attribs->ppConversionStream == (IHLSL2GLSLConversionStream *)0x0) {
      CreateStream(this,Attribs->InputFileName,Attribs->pSourceStreamFactory,Attribs->HLSLSource,
                   Attribs->NumSymbols,Attribs->ppConversionStream);
      this_00 = ClassPtrCast<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IHLSL2GLSLConversionStream>
                          (*Attribs->ppConversionStream);
    }
    ConversionStream::Convert_abi_cxx11_
              (__return_storage_ptr__,this_00,Attribs->EntryPoint,Attribs->ShaderType,
               Attribs->IncludeDefinitions,Attribs->SamplerSuffix,
               Attribs->UseInOutLocationQualifiers,Attribs->UseRowMajorMatrices);
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::Convert(ConversionAttribs& Attribs) const
{
    if (Attribs.ppConversionStream == nullptr)
    {
        try
        {
            ConversionStream Stream(nullptr, *this, Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, false);
            return Stream.Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                  Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                  Attribs.UseRowMajorMatrices);
        }
        catch (std::runtime_error&)
        {
            return "";
        }
    }
    else
    {
        ConversionStream* pStream = nullptr;
        if (*Attribs.ppConversionStream != nullptr)
        {
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);

            const auto& FileNameFromStream = pStream->GetInputFileName();
            if (FileNameFromStream != Attribs.InputFileName)
            {
                LOG_WARNING_MESSAGE("Input stream was initialized for input file \"", FileNameFromStream, "\" that does not match the name of the file to be converted \"", Attribs.InputFileName, "\". New stream will be created");
                (*Attribs.ppConversionStream)->Release();
                *Attribs.ppConversionStream = nullptr;
            }
        }

        if (*Attribs.ppConversionStream == nullptr)
        {
            CreateStream(Attribs.InputFileName, Attribs.pSourceStreamFactory, Attribs.HLSLSource, Attribs.NumSymbols, Attribs.ppConversionStream);
            pStream = ClassPtrCast<ConversionStream>(*Attribs.ppConversionStream);
        }

        return pStream->Convert(Attribs.EntryPoint, Attribs.ShaderType, Attribs.IncludeDefinitions,
                                Attribs.SamplerSuffix, Attribs.UseInOutLocationQualifiers,
                                Attribs.UseRowMajorMatrices);
    }
}